

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O2

void runCommand(string *strCommand)

{
  long lVar1;
  string_view source_file;
  bool bVar2;
  Logger *pLVar3;
  int *in_R8;
  long in_FS_OFFSET;
  string_view str;
  string_view logging_function;
  int nErr;
  string local_50;
  string log_msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (strCommand->_M_string_length != 0) {
    nErr = system((strCommand->_M_dataplus)._M_p);
    if (nErr != 0) {
      pLVar3 = LogInstance();
      bVar2 = BCLog::Logger::Enabled(pLVar3);
      if (bVar2) {
        log_msg._M_dataplus._M_p = (pointer)&log_msg.field_2;
        log_msg._M_string_length = 0;
        log_msg.field_2._M_local_buf[0] = '\0';
        tinyformat::format<std::__cxx11::string,int>
                  (&local_50,(tinyformat *)"runCommand error: system(%s) returned %d\n",
                   (char *)strCommand,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nErr,in_R8)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&log_msg,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
        pLVar3 = LogInstance();
        local_50._M_dataplus._M_p = (pointer)0x5a;
        local_50._M_string_length = 0x41478f;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/common/system.cpp"
        ;
        source_file._M_len = 0x5a;
        str._M_str = log_msg._M_dataplus._M_p;
        str._M_len = log_msg._M_string_length;
        logging_function._M_str = "runCommand";
        logging_function._M_len = 10;
        BCLog::Logger::LogPrintStr(pLVar3,str,logging_function,source_file,0x37,ALL,Info);
        std::__cxx11::string::~string((string *)&log_msg);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void runCommand(const std::string& strCommand)
{
    if (strCommand.empty()) return;
#ifndef WIN32
    int nErr = ::system(strCommand.c_str());
#else
    int nErr = ::_wsystem(std::wstring_convert<std::codecvt_utf8_utf16<wchar_t>,wchar_t>().from_bytes(strCommand).c_str());
#endif
    if (nErr)
        LogPrintf("runCommand error: system(%s) returned %d\n", strCommand, nErr);
}